

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O3

void __thiscall
helics::ValueFederateManager::removeTarget(ValueFederateManager *this,Input *inp,string_view target)

{
  int iVar1;
  iterator __position;
  _Base_ptr __n;
  _Rb_tree_iterator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  el;
  size_type __rlen;
  InterfaceHandle *__k;
  pair<std::_Rb_tree_iterator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar2;
  handle iTHandle;
  handle local_48;
  
  __n = (_Base_ptr)target._M_len;
  gmlc::libguarded::
  shared_guarded_opt<std::multimap<helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_mutex>
  ::lock(&local_48,&this->inputTargets);
  __k = &(inp->super_Interface).handle;
  pVar2 = std::
          _Rb_tree<helics::InterfaceHandle,_std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::equal_range(&(local_48.data)->_M_t,__k);
  __position._M_node = (_Base_ptr)pVar2.first._M_node;
  do {
    if (__position._M_node == pVar2.second._M_node._M_node) {
LAB_001f13d1:
      std::unique_lock<std::shared_mutex>::~unique_lock(&local_48.m_handle_lock);
      return;
    }
    if ((__position._M_node[1]._M_left == __n) &&
       ((__n == (_Base_ptr)0x0 ||
        (iVar1 = bcmp(target._M_str,__position._M_node[1]._M_parent,(size_t)__n), iVar1 == 0)))) {
      (*this->coreObject->_vptr_Core[0x29])
                (this->coreObject,(ulong)(uint)__k->hid,__n,target._M_str);
      std::
      _Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,std::__cxx11::string>,std::_Select1st<std::pair<helics::InterfaceHandle_const,std::__cxx11::string>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,std::__cxx11::string>>>
      ::erase_abi_cxx11_((_Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,std::__cxx11::string>,std::_Select1st<std::pair<helics::InterfaceHandle_const,std::__cxx11::string>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,std::__cxx11::string>>>
                          *)local_48.data,__position);
      goto LAB_001f13d1;
    }
    __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
  } while( true );
}

Assistant:

void ValueFederateManager::removeTarget(const Input& inp, std::string_view target)
{
    auto iTHandle = inputTargets.lock();
    auto rng = iTHandle->equal_range(inp.handle);
    for (auto el = rng.first; el != rng.second; ++el) {
        if (el->second == target) {
            coreObject->removeTarget(inp.handle, target);
            iTHandle->erase(el);
            break;
        }
    }
    // TODO(PT): erase from targetID's
}